

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int * getBiomeParaLimits(int mc,int id)

{
  int *piVar1;
  int (*paiVar2) [13];
  long lVar3;
  long lVar4;
  
  if (mc < 0x16) {
    return (int *)0x0;
  }
  if ((uint)mc < 0x1c) {
    if (0x18 < (uint)mc) {
      if (id == 6) goto LAB_00115586;
      goto LAB_00115592;
    }
LAB_001155b3:
    if (mc == 0x16) {
LAB_001155b8:
      if (id == 0) {
        paiVar2 = g_biome_para_range_18;
      }
      else {
        lVar3 = 0;
        do {
          lVar4 = lVar3;
          if (lVar4 + 0x34 == 0xa28) {
            return (int *)0x0;
          }
          lVar3 = lVar4 + 0x34;
        } while (*(int *)((long)g_biome_para_range_18[1] + lVar4) != id);
        paiVar2 = (int (*) [13])(lVar4 + 0x12d064);
      }
      goto LAB_00115621;
    }
    if (id == 0xa5) {
      paiVar2 = g_biome_para_range_19_diff;
      goto LAB_00115621;
    }
    paiVar2 = g_biome_para_range_19_diff;
    lVar3 = 0;
    do {
      lVar4 = lVar3 + 0x34;
      if (lVar4 == 0x138) goto LAB_001155b8;
      piVar1 = (int *)((long)g_biome_para_range_19_diff[1] + lVar3);
      lVar3 = lVar4;
    } while (*piVar1 != id);
  }
  else {
    if (id == 6) {
LAB_00115586:
      paiVar2 = g_biome_para_range_20_diff;
      goto LAB_00115621;
    }
    if (id == 0xba) {
      return g_biome_para_range_21wd_diff[0] + 1;
    }
LAB_00115592:
    paiVar2 = g_biome_para_range_20_diff;
    lVar3 = 0;
    do {
      lVar4 = lVar3 + 0x34;
      if (lVar4 == 0x16c) goto LAB_001155b3;
      piVar1 = (int *)((long)g_biome_para_range_20_diff[1] + lVar3);
      lVar3 = lVar4;
    } while (*piVar1 != id);
  }
  paiVar2 = (int (*) [13])((long)*paiVar2 + lVar4);
LAB_00115621:
  return *paiVar2 + 1;
}

Assistant:

const int *getBiomeParaLimits(int mc, int id)
{
    if (mc <= MC_1_17)
        return NULL;
    int i;
    if (mc > MC_1_21_3)
    {
        for (i = 0; g_biome_para_range_21wd_diff[i][0] != -1; i++)
        {
            if (g_biome_para_range_21wd_diff[i][0] == id)
                return &g_biome_para_range_21wd_diff[i][1];
        }
    }
    if (mc > MC_1_19)
    {
        for (i = 0; g_biome_para_range_20_diff[i][0] != -1; i++)
        {
            if (g_biome_para_range_20_diff[i][0] == id)
                return &g_biome_para_range_20_diff[i][1];
        }
    }
    if (mc > MC_1_18)
    {
        for (i = 0; g_biome_para_range_19_diff[i][0] != -1; i++)
        {
            if (g_biome_para_range_19_diff[i][0] == id)
                return &g_biome_para_range_19_diff[i][1];
        }
    }
    for (i = 0; g_biome_para_range_18[i][0] != -1; i++)
    {
        if (g_biome_para_range_18[i][0] == id)
            return &g_biome_para_range_18[i][1];
    }
    return NULL;
}